

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O1

void __thiscall QualEngine::~QualEngine(QualEngine *this)

{
  pointer pcVar1;
  pointer piVar2;
  int in_ESI;
  
  close(this,in_ESI);
  pcVar1 = (this->flowDirection).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  piVar2 = (this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

QualEngine::~QualEngine()
{
    close();

//    cout << "\nQualEngine destructed.\n";
}